

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  iterator this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer ppVar4;
  char *pcVar5;
  SourceFileFlags SVar6;
  bool stripResources;
  allocator local_61;
  string local_60;
  char *local_40;
  char *location;
  _Self local_30;
  iterator si;
  cmSourceFile *sf_local;
  cmGeneratorTarget *this_local;
  SourceFileFlags flags;
  
  si._M_node = (_Base_ptr)sf;
  SourceFileFlags::SourceFileFlags((SourceFileFlags *)&this_local);
  ConstructSourceFileFlags(this);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
       ::find(&this->SourceFlagsMap,(key_type *)&si);
  location = (char *)std::
                     map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                     ::end(&this->SourceFlagsMap);
  bVar1 = std::operator!=(&local_30,(_Self *)&location);
  this_00 = si;
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>
             ::operator->(&local_30);
    this_local = *(cmGeneratorTarget **)&ppVar4->second;
    flags._0_8_ = (ppVar4->second).MacFolder;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"MACOSX_PACKAGE_LOCATION",&local_61);
    pcVar5 = cmSourceFile::GetProperty((cmSourceFile *)this_00._M_node,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (pcVar5 != (char *)0x0) {
      local_40 = pcVar5;
      flags._0_8_ = pcVar5;
      uVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x24])
                        (this->GlobalGenerator,this->Makefile);
      iVar3 = strcmp(local_40,"Resources");
      if (iVar3 == 0) {
        this_local = (cmGeneratorTarget *)0x3;
        if ((uVar2 & 1) != 0) {
          flags._0_8_ = (long)"PK\x01\x02" + 4;
        }
      }
      else {
        bVar1 = cmsys::SystemTools::StringStartsWith(local_40,"Resources/");
        if (bVar1) {
          this_local = (cmGeneratorTarget *)0x4;
          if ((uVar2 & 1) != 0) {
            flags._0_8_ = flags._0_8_ + 10;
          }
        }
        else {
          this_local = (cmGeneratorTarget *)0x5;
        }
      }
    }
  }
  SVar6._0_8_ = (ulong)this_local & 0xffffffff;
  SVar6.MacFolder = (char *)flags._0_8_;
  return SVar6;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location;
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (strcmp(location, "Resources") == 0) {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmSystemTools::StringStartsWith(location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += strlen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}